

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

bool __thiscall httplib::ClientImpl::send_(ClientImpl *this,Request *req,Response *res,Error *error)

{
  Headers *this_00;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__v;
  _Rb_tree_header *p_Var1;
  ulong *puVar2;
  Headers *pHVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int *piVar7;
  ssize_t sVar8;
  pthread_t pVar9;
  pthread_t pVar10;
  iterator iVar11;
  _Base_ptr p_Var12;
  byte bVar13;
  pthread_mutex_t *__mutex;
  ulong uVar14;
  Socket *pSVar15;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar16;
  bool close_connection;
  bool ret;
  char buf [1];
  byte local_111;
  pthread_mutex_t *local_110;
  Socket *local_108;
  Request *local_100;
  _Rb_tree_node_base local_f8;
  undefined8 *local_d8;
  undefined8 uStack_d0;
  code *local_c8;
  code *pcStack_c0;
  _Any_data local_b8;
  code *local_a8;
  code *pcStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  __mutex = (pthread_mutex_t *)&this->socket_mutex_;
  local_100 = req;
  local_f8._M_right = (_Base_ptr)res;
  iVar4 = pthread_mutex_lock(__mutex);
  if (iVar4 != 0) {
    std::__throw_system_error(iVar4);
    goto LAB_00140b81;
  }
  this->socket_should_be_closed_when_request_is_done_ = false;
  pSVar15 = &this->socket_;
  iVar4 = (this->socket_).sock;
  local_108 = pSVar15;
  if (iVar4 == -1) goto LAB_00140979;
  if (iVar4 < 0x400) {
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_88 = 0;
    uStack_80 = 0;
    local_98 = 0;
    uStack_90 = 0;
    local_a8 = (code *)0x0;
    pcStack_a0 = (code *)0x0;
    local_b8._M_unused._M_object = (Headers *)0x0;
    local_b8._8_8_ = 0;
    iVar5 = iVar4 + 0x3f;
    if (-1 < iVar4) {
      iVar5 = iVar4;
    }
    puVar2 = (ulong *)((long)&local_b8 + (long)(iVar5 >> 6) * 8);
    *puVar2 = *puVar2 | 1L << ((byte)(iVar4 % 0x40) & 0x3f);
    local_f8._0_8_ = 0;
    local_f8._M_parent = (_Base_ptr)0x0;
    local_110 = __mutex;
    do {
      iVar5 = select(iVar4 + 1,(fd_set *)&local_b8,(fd_set *)0x0,(fd_set *)0x0,(timeval *)&local_f8)
      ;
      if (-1 < iVar5) {
        __mutex = local_110;
        if (iVar5 == 0) goto LAB_0014098c;
        goto LAB_001408f6;
      }
      piVar7 = __errno_location();
    } while (*piVar7 == 4);
    __mutex = local_110;
    pSVar15 = local_108;
    if (*piVar7 != 9) goto LAB_001408f6;
  }
  else {
LAB_001408f6:
    pSVar15 = local_108;
    do {
      sVar8 = recv(iVar4,&local_b8,1,2);
      if (-1 < sVar8) {
        if (sVar8 != 0) goto LAB_0014098c;
        break;
      }
      piVar7 = __errno_location();
    } while (*piVar7 == 4);
  }
  (*this->_vptr_ClientImpl[4])(this,pSVar15,0);
  if (pSVar15->sock != -1) {
    shutdown(pSVar15->sock,2);
  }
  if ((this->socket_requests_in_flight_ == 0) ||
     (pVar10 = (this->socket_requests_are_from_thread_)._M_thread, pVar9 = pthread_self(),
     pVar10 == pVar9)) {
    if (pSVar15->sock != -1) {
      close(pSVar15->sock);
      pSVar15->sock = -1;
    }
LAB_00140979:
    iVar4 = (*this->_vptr_ClientImpl[3])(this,pSVar15,error);
    if ((char)iVar4 == '\0') {
      pthread_mutex_unlock(__mutex);
      bVar13 = 0;
    }
    else {
LAB_0014098c:
      uVar14 = this->socket_requests_in_flight_;
      local_f8._M_left = (_Base_ptr)error;
      if (uVar14 < 2) {
        pVar10 = pthread_self();
      }
      else {
        pVar9 = (this->socket_requests_are_from_thread_)._M_thread;
        pVar10 = pthread_self();
        if (pVar9 != pVar10) {
          __assert_fail("socket_requests_are_from_thread_ == std::this_thread::get_id()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/nickware44[P]interference/3rdparty/httplib.h"
                        ,0x1928,"bool httplib::ClientImpl::send_(Request &, Response &, Error &)");
        }
      }
      this->socket_requests_in_flight_ = uVar14 + 1;
      (this->socket_requests_are_from_thread_)._M_thread = pVar10;
      pthread_mutex_unlock(__mutex);
      p_Var12 = (this->default_headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var1 = &(this->default_headers_)._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var12 != p_Var1) {
        this_00 = &local_100->headers;
        pHVar3 = &local_100->headers;
        do {
          __v = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)(p_Var12 + 1);
          iVar11 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::find(&this_00->_M_t,(key_type *)__v);
          if ((_Rb_tree_header *)iVar11._M_node == &(pHVar3->_M_t)._M_impl.super__Rb_tree_header) {
            pVar16 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::_M_get_insert_equal_pos(&this_00->_M_t,(key_type *)__v);
            local_b8._M_unused._0_8_ = (undefined8)this_00;
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::
            _M_insert_<std::pair<std::__cxx11::string_const,std::__cxx11::string>const&,std::_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>::_Alloc_node>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)this_00,pVar16.first,pVar16.second,__v,(_Alloc_node *)&local_b8);
          }
          p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
        } while ((_Rb_tree_header *)p_Var12 != p_Var1);
      }
      local_f8._0_8_ = local_f8._0_8_ & 0xffffffffffffff00;
      local_111 = this->keep_alive_ ^ 1;
      local_b8._M_unused._M_object = operator_new(0x18);
      *(ClientImpl **)local_b8._M_unused._0_8_ = this;
      *(byte **)((long)local_b8._M_unused._0_8_ + 8) = &local_111;
      *(_Rb_tree_node_base **)((long)local_b8._M_unused._0_8_ + 0x10) = &local_f8;
      pcStack_a0 = std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/nickware44[P]interference/3rdparty/httplib.h:6455:32)>
                   ::_M_invoke;
      local_b8._8_8_ = 0;
      local_a8 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/nickware44[P]interference/3rdparty/httplib.h:6455:32)>
                 ::_M_manager;
      local_98 = CONCAT71(local_98._1_7_,1);
      local_c8 = (code *)0x0;
      pcStack_c0 = (code *)0x0;
      local_d8 = (undefined8 *)0x0;
      uStack_d0 = 0;
      local_d8 = (undefined8 *)operator_new(0x28);
      p_Var12 = local_f8._M_left;
      *local_d8 = this;
      local_d8[1] = local_100;
      local_d8[2] = local_f8._M_right;
      local_d8[3] = &local_111;
      local_d8[4] = local_f8._M_left;
      pcStack_c0 = std::
                   _Function_handler<bool_(httplib::Stream_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/nickware44[P]interference/3rdparty/httplib.h:6472:33)>
                   ::_M_invoke;
      local_c8 = std::
                 _Function_handler<bool_(httplib::Stream_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/nickware44[P]interference/3rdparty/httplib.h:6472:33)>
                 ::_M_manager;
      uVar6 = (*this->_vptr_ClientImpl[5])(this,local_108);
      uVar14 = (ulong)uVar6;
      local_f8._M_color._0_1_ = (char)uVar6;
      if (local_c8 != (code *)0x0) {
        (*local_c8)(&local_d8,&local_d8,3);
        uVar14 = local_f8._0_8_ & 0xff;
      }
      bVar13 = (byte)uVar14;
      if (((uVar14 & 1) == 0) && (p_Var12->_M_color == _S_red)) {
        p_Var12->_M_color = _S_black;
      }
      detail::scope_exit::~scope_exit((scope_exit *)&local_b8);
    }
    return (bool)(bVar13 & 1);
  }
LAB_00140b81:
  __assert_fail("socket_requests_in_flight_ == 0 || socket_requests_are_from_thread_ == std::this_thread::get_id()"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/nickware44[P]interference/3rdparty/httplib.h"
                ,0x18c1,"void httplib::ClientImpl::close_socket(Socket &)");
}

Assistant:

inline bool ClientImpl::send_(Request &req, Response &res, Error &error) {
  {
    std::lock_guard<std::mutex> guard(socket_mutex_);

    // Set this to false immediately - if it ever gets set to true by the end of
    // the request, we know another thread instructed us to close the socket.
    socket_should_be_closed_when_request_is_done_ = false;

    auto is_alive = false;
    if (socket_.is_open()) {
      is_alive = detail::is_socket_alive(socket_.sock);
      if (!is_alive) {
        // Attempt to avoid sigpipe by shutting down nongracefully if it seems
        // like the other side has already closed the connection Also, there
        // cannot be any requests in flight from other threads since we locked
        // request_mutex_, so safe to close everything immediately
        const bool shutdown_gracefully = false;
        shutdown_ssl(socket_, shutdown_gracefully);
        shutdown_socket(socket_);
        close_socket(socket_);
      }
    }

    if (!is_alive) {
      if (!create_and_connect_socket(socket_, error)) { return false; }

#ifdef CPPHTTPLIB_OPENSSL_SUPPORT
      // TODO: refactoring
      if (is_ssl()) {
        auto &scli = static_cast<SSLClient &>(*this);
        if (!proxy_host_.empty() && proxy_port_ != -1) {
          auto success = false;
          if (!scli.connect_with_proxy(socket_, res, success, error)) {
            return success;
          }
        }

        if (!scli.initialize_ssl(socket_, error)) { return false; }
      }
#endif
    }

    // Mark the current socket as being in use so that it cannot be closed by
    // anyone else while this request is ongoing, even though we will be
    // releasing the mutex.
    if (socket_requests_in_flight_ > 1) {
      assert(socket_requests_are_from_thread_ == std::this_thread::get_id());
    }
    socket_requests_in_flight_ += 1;
    socket_requests_are_from_thread_ = std::this_thread::get_id();
  }

  for (const auto &header : default_headers_) {
    if (req.headers.find(header.first) == req.headers.end()) {
      req.headers.insert(header);
    }
  }

  auto ret = false;
  auto close_connection = !keep_alive_;

  auto se = detail::scope_exit([&]() {
    // Briefly lock mutex in order to mark that a request is no longer ongoing
    std::lock_guard<std::mutex> guard(socket_mutex_);
    socket_requests_in_flight_ -= 1;
    if (socket_requests_in_flight_ <= 0) {
      assert(socket_requests_in_flight_ == 0);
      socket_requests_are_from_thread_ = std::thread::id();
    }

    if (socket_should_be_closed_when_request_is_done_ || close_connection ||
        !ret) {
      shutdown_ssl(socket_, true);
      shutdown_socket(socket_);
      close_socket(socket_);
    }
  });

  ret = process_socket(socket_, [&](Stream &strm) {
    return handle_request(strm, req, res, close_connection, error);
  });

  if (!ret) {
    if (error == Error::Success) { error = Error::Unknown; }
  }

  return ret;
}